

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O3

string * sc_core::localtime_string_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  time_t long_time;
  char buf [200];
  time_t local_e0;
  char local_d8 [200];
  
  time(&local_e0);
  __tp = localtime(&local_e0);
  strftime(local_d8,199,"%b %d, %Y       %H:%M:%S",__tp);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_d8);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

SC_API std::string
localtime_string()
{
    char buf[200];
    time_t long_time;
    time(&long_time);
    struct tm* p_tm = localtime(&long_time);
    strftime(buf, 199, "%b %d, %Y       %H:%M:%S", p_tm);
    return buf;
}